

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O2

EStatusCode __thiscall
ShadingWriter::WriteShadingPatternObjectWithPDFNativeFunctions
          (ShadingWriter *this,RadialShading *inRadialShading,PDFRectangle *inBounds,
          PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  EStatusCode EVar1;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  double local_18;
  double dStack_10;
  
  local_38 = inRadialShading->x0;
  dStack_30 = inRadialShading->y0;
  local_28 = inRadialShading->r0;
  dStack_20 = inRadialShading->x1;
  local_18 = inRadialShading->y1;
  dStack_10 = inRadialShading->r1;
  EVar1 = WriteShadingPatternObjectWithPDFNativeFunctions
                    (this,3,&local_38,6,&inRadialShading->colorLine,(PDFRectangle *)inMatrix,
                     inMatrix,inPatternObjectId);
  return EVar1;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteShadingPatternObjectWithPDFNativeFunctions(
    const RadialShading& inRadialShading, 
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId
) {
    double coords[] = {inRadialShading.x0, inRadialShading.y0, inRadialShading.r0,
                       inRadialShading.x1, inRadialShading.y1, inRadialShading.r1};

    return WriteShadingPatternObjectWithPDFNativeFunctions(
        3,
        coords,
        6,
        inRadialShading.colorLine,
        inBounds,
        inMatrix,
        inPatternObjectId
    );
}